

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O3

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoQuad>::Print
          (TPZGeoElRefPattern<pzgeom::TPZGeoQuad> *this,ostream *out)

{
  TPZReference *pTVar1;
  TPZRefPattern *this_00;
  
  TPZGeoElRefLess<pzgeom::TPZGeoQuad>::Print(&this->super_TPZGeoElRefLess<pzgeom::TPZGeoQuad>,out);
  pTVar1 = (this->fRefPattern).fRef;
  if ((pTVar1 != (TPZReference *)0x0) &&
     (this_00 = pTVar1->fPointer, this_00 != (TPZRefPattern *)0x0)) {
    TPZRefPattern::ShortPrint(this_00,out);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
    std::ostream::put((char)out);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Print(std::ostream & out)
{
	TPZGeoElRefLess<TGeo>::Print(out);
	
	if(fRefPattern)
	{
		fRefPattern->ShortPrint(out);
		out << std::endl;
	}
}